

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_tv_ct(CTState *cts,CType *s,CTypeID sid,TValue *o,uint8_t *sp)

{
  uint uVar1;
  CType *pCVar2;
  GCcdata *pGVar3;
  void *pvVar4;
  bool bVar5;
  uint local_160;
  CTSize sz;
  GCcdata *cd;
  uint32_t b;
  CTInfo sinfo;
  uint8_t *sp_local;
  TValue *o_local;
  CTypeID sid_local;
  CType *s_local;
  CTState *cts_local;
  GCcdata *cd_1;
  
  uVar1 = s->info;
  if (uVar1 >> 0x1c == 0) {
    if ((uVar1 & 0xf8000000) == 0x8000000) {
      if (s->size == 1) {
        bVar5 = *sp != '\0';
      }
      else {
        bVar5 = *(int *)sp != 0;
      }
      local_160 = (uint)bVar5;
      o->u64 = (ulong)(local_160 + 1) << 0x2f ^ 0xffffffffffffffff;
      (cts->g->tmptv2).u64 = (ulong)(local_160 + 1) << 0x2f ^ 0xffffffffffffffff;
    }
    else {
      if (((uVar1 & 0xfc000000) == 0) && (4 < s->size)) goto LAB_00190cf5;
      lj_cconv_ct_ct(cts,cts->tab + 0xe,s,(uint8_t *)&o->u64,sp,0);
    }
    cts_local._0_4_ = 0;
  }
  else {
    if (((uVar1 & 0xfc000000) == 0x30000000) || (uVar1 >> 0x1c == 1)) {
      pGVar3 = lj_cdata_newref(cts,sp,sid);
      o->u64 = (ulong)pGVar3 | 0xfffa800000000000;
      return 1;
    }
LAB_00190cf5:
    uVar1 = s->size;
    pCVar2 = cts->tab;
    pvVar4 = lj_mem_newgco(cts->L,(ulong)uVar1 + 0x10);
    *(undefined1 *)((long)pvVar4 + 9) = 10;
    *(short *)((long)pvVar4 + 10) = (short)(((long)s - (long)pCVar2) / 0x18);
    o->u64 = (ulong)pvVar4 | 0xfffa800000000000;
    memcpy((void *)((long)pvVar4 + 0x10),sp,(ulong)uVar1);
    cts_local._0_4_ = 1;
  }
  return (int)cts_local;
}

Assistant:

int lj_cconv_tv_ct(CTState *cts, CType *s, CTypeID sid,
		   TValue *o, uint8_t *sp)
{
  CTInfo sinfo = s->info;
  if (ctype_isnum(sinfo)) {
    if (!ctype_isbool(sinfo)) {
      if (ctype_isinteger(sinfo) && s->size > 4) goto copyval;
      if (LJ_DUALNUM && ctype_isinteger(sinfo)) {
	int32_t i;
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT32), s,
		       (uint8_t *)&i, sp, 0);
	if ((sinfo & CTF_UNSIGNED) && i < 0)
	  setnumV(o, (lua_Number)(uint32_t)i);
	else
	  setintV(o, i);
      } else {
	lj_cconv_ct_ct(cts, ctype_get(cts, CTID_DOUBLE), s,
		       (uint8_t *)&o->n, sp, 0);
	/* Numbers are NOT canonicalized here! Beware of uninitialized data. */
	lj_assertCTS(tvisnum(o), "non-canonical NaN passed");
      }
    } else {
      uint32_t b = s->size == 1 ? (*sp != 0) : (*(int *)sp != 0);
      setboolV(o, b);
      setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
    }
    return 0;
  } else if (ctype_isrefarray(sinfo) || ctype_isstruct(sinfo)) {
    /* Create reference. */
    setcdataV(cts->L, o, lj_cdata_newref(cts, sp, sid));
    return 1;  /* Need GC step. */
  } else {
    GCcdata *cd;
    CTSize sz;
  copyval:  /* Copy value. */
    sz = s->size;
    lj_assertCTS(sz != CTSIZE_INVALID, "value copy with invalid size");
    /* Attributes are stripped, qualifiers are kept (but mostly ignored). */
    cd = lj_cdata_new(cts, ctype_typeid(cts, s), sz);
    setcdataV(cts->L, o, cd);
    memcpy(cdataptr(cd), sp, sz);
    return 1;  /* Need GC step. */
  }
}